

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O3

void __thiscall
anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>::Entry
          (Entry<anurbs::NurbsCurveGeometry<3L>_> *this,string *key,
          shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *data,
          shared_ptr<anurbs::Attributes> *attributes)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_EntryBase)._vptr_EntryBase = (_func_int **)&PTR_key_abi_cxx11__00374140;
  (this->m_key)._M_dataplus._M_p = (pointer)&(this->m_key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_key,pcVar1,pcVar1 + key->_M_string_length);
  (this->m_data).super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (data->super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (data->super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_data).super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->m_attributes).super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (attributes->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (attributes->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_attributes).super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

Entry(const std::string& key, std::shared_ptr<TData> data,
        std::shared_ptr<Attributes> attributes)
        : m_key(key), m_data(data), m_attributes(attributes)
    {
    }